

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiftMotor.h
# Opt level: O2

void __thiscall LiftMotor::UpdateSwitches(LiftMotor *this,int z)

{
  if (this->zmax == z) {
    this->LimitSwitchBottom = false;
    this->LimitSwitchTop = true;
    return;
  }
  this->LimitSwitchTop = false;
  if (this->zmin == z) {
    this->LimitSwitchBottom = true;
    return;
  }
  this->LimitSwitchBottom = false;
  return;
}

Assistant:

void LiftMotor::UpdateSwitches(int z)
{
	if (z == zmax)
	{
		LimitSwitchTop = true;
		LimitSwitchBottom = false;
	}

	else if (z == zmin)
	{
		LimitSwitchTop = false;
		LimitSwitchBottom = true;
	}

	else
	{
		LimitSwitchTop = false;
		LimitSwitchBottom = false;
	}
}